

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::NestedDescriptorTest::SetUp(NestedDescriptorTest *this)

{
  int iVar1;
  Descriptor *pDVar2;
  Descriptor *pDVar3;
  EnumDescriptor *pEVar4;
  DescriptorProto *pDVar5;
  EnumDescriptorProto *pEVar6;
  FileDescriptor *pFVar7;
  Nonnull<const_char_*> pcVar8;
  Arena *arena;
  long lVar9;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar10;
  char *in_R9;
  string_view value;
  string_view value_00;
  string_view value_01;
  FileDescriptorProto bar_file;
  FileDescriptorProto foo_file;
  AssertHelper local_250;
  undefined1 local_248 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  Message local_228;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_220;
  AssertHelper local_218;
  undefined1 local_210 [208];
  ArenaStringPtr local_140 [5];
  undefined1 local_118 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_118,(Arena *)0x0);
  local_118[0x10] = local_118[0x10] | 1;
  if ((local_118._8_8_ & 1) != 0) {
    local_118._8_8_ = *(undefined8 *)(local_118._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_118 + 200),value,(Arena *)local_118._8_8_);
  pcVar10 = local_210 + 0x10;
  local_210._0_8_ = pcVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"TestMessage","");
  pDVar5 = AddMessage((FileDescriptorProto *)local_118,(string *)local_210);
  if ((pointer)local_210._0_8_ != pcVar10) {
    operator_delete((void *)local_210._0_8_,CONCAT71(local_210._17_7_,local_210[0x10]) + 1);
  }
  local_210._0_8_ = pcVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Foo","");
  AddNestedMessage(pDVar5,(string *)local_210);
  if ((pointer)local_210._0_8_ != pcVar10) {
    operator_delete((void *)local_210._0_8_,CONCAT71(local_210._17_7_,local_210[0x10]) + 1);
  }
  local_210._0_8_ = pcVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Bar","");
  AddNestedMessage(pDVar5,(string *)local_210);
  if ((pointer)local_210._0_8_ != pcVar10) {
    operator_delete((void *)local_210._0_8_,CONCAT71(local_210._17_7_,local_210[0x10]) + 1);
  }
  local_210._0_8_ = pcVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Baz","");
  pEVar6 = AddNestedEnum(pDVar5,(string *)local_210);
  if ((pointer)local_210._0_8_ != pcVar10) {
    operator_delete((void *)local_210._0_8_,CONCAT71(local_210._17_7_,local_210[0x10]) + 1);
  }
  local_210._0_8_ = pcVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"A","");
  AddEnumValue(pEVar6,(string *)local_210,1);
  if ((pointer)local_210._0_8_ != pcVar10) {
    operator_delete((void *)local_210._0_8_,CONCAT71(local_210._17_7_,local_210[0x10]) + 1);
  }
  local_210._0_8_ = pcVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Moo","");
  pEVar6 = AddNestedEnum(pDVar5,(string *)local_210);
  if ((pointer)local_210._0_8_ != pcVar10) {
    operator_delete((void *)local_210._0_8_,CONCAT71(local_210._17_7_,local_210[0x10]) + 1);
  }
  local_210._0_8_ = pcVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"B","");
  AddEnumValue(pEVar6,(string *)local_210,1);
  if ((pointer)local_210._0_8_ != pcVar10) {
    operator_delete((void *)local_210._0_8_,CONCAT71(local_210._17_7_,local_210[0x10]) + 1);
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_210,(Arena *)0x0);
  local_210[0x10] = local_210[0x10] | 1;
  arena = (Arena *)local_210._8_8_;
  if ((local_210._8_8_ & 1) != 0) {
    arena = *(Arena **)(local_210._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "bar.proto";
  value_00._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(local_210 + 200),value_00,arena);
  local_210[0x10] = local_210[0x10] | 2;
  if ((local_210._8_8_ & 1) != 0) {
    local_210._8_8_ = *(undefined8 *)(local_210._8_8_ & 0xfffffffffffffffe);
  }
  value_01._M_str = "corge.grault";
  value_01._M_len = 0xc;
  protobuf::internal::ArenaStringPtr::Set(local_140,value_01,(Arena *)local_210._8_8_);
  local_248 = (undefined1  [8])&local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"TestMessage2","");
  pDVar5 = AddMessage((FileDescriptorProto *)local_210,(string *)local_248);
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  local_248 = (undefined1  [8])&local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Foo","");
  AddNestedMessage(pDVar5,(string *)local_248);
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  local_248 = (undefined1  [8])&local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Baz","");
  AddNestedMessage(pDVar5,(string *)local_248);
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  local_248 = (undefined1  [8])&local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Moo","");
  pEVar6 = AddNestedEnum(pDVar5,(string *)local_248);
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  local_248 = (undefined1  [8])&local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"A","");
  AddEnumValue(pEVar6,(string *)local_248,1);
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  local_248 = (undefined1  [8])&local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Mooo","");
  pEVar6 = AddNestedEnum(pDVar5,(string *)local_248);
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  local_248 = (undefined1  [8])&local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"C","");
  AddEnumValue(pEVar6,(string *)local_248,1);
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  pFVar7 = DescriptorPool::BuildFile(&this->pool_,(FileDescriptorProto *)local_118);
  this->foo_file_ = pFVar7;
  local_228.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_228.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,pFVar7 != (FileDescriptor *)0x0);
  local_220._M_head_impl = (LogMessageData *)0x0;
  if (pFVar7 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_248,(internal *)&local_228,(AssertionResult *)"foo_file_ != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x812,(char *)local_248);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_250);
LAB_005fa6bf:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_220;
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_248 != (undefined1  [8])&local_238) {
      operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_250.data_._4_4_,(int)local_250.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_250.data_._4_4_,(int)local_250.data_) + 8))();
    }
    local_240._M_head_impl = local_220._M_head_impl;
    if (local_220._M_head_impl == (LogMessageData *)0x0) goto LAB_005faa66;
  }
  else {
    pFVar7 = DescriptorPool::BuildFile(&this->pool_,(FileDescriptorProto *)local_210);
    this->bar_file_ = pFVar7;
    local_228.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_228.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,pFVar7 != (FileDescriptor *)0x0);
    local_220._M_head_impl = (LogMessageData *)0x0;
    if (pFVar7 == (FileDescriptor *)0x0) {
      testing::Message::Message((Message *)&local_250);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_248,(internal *)&local_228,
                 (AssertionResult *)"bar_file_ != nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x815,(char *)local_248);
      testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_250);
      goto LAB_005fa6bf;
    }
    local_228.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    local_250.data_._0_4_ = this->foo_file_->message_type_count_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_248,"1","foo_file_->message_type_count()",(int *)&local_228,
               (int *)&local_250);
    if (local_248[0] == (string)0x0) {
      testing::Message::Message(&local_228);
      if (local_240._M_head_impl == (LogMessageData *)0x0) {
        pcVar10 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar10 = (pointer)((local_240._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x817,pcVar10);
      testing::internal::AssertHelper::operator=(&local_250,&local_228);
    }
    else {
      if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_240._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_240._M_head_impl);
      }
      lVar9 = (long)this->foo_file_->message_type_count_;
      if (lVar9 < 1) {
        pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,lVar9,"index < message_type_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_248,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xae7,pcVar8);
        goto LAB_005fad09;
      }
      pDVar2 = this->foo_file_->message_types_;
      this->message_ = pDVar2;
      local_228.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 2;
      local_250.data_._0_4_ = pDVar2->nested_type_count_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_248,"2","message_->nested_type_count()",(int *)&local_228,
                 (int *)&local_250);
      if (local_248[0] == (string)0x0) {
        testing::Message::Message(&local_228);
        if (local_240._M_head_impl == (LogMessageData *)0x0) {
          pcVar10 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar10 = (pointer)((local_240._M_head_impl)->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_250,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x81a,pcVar10);
        testing::internal::AssertHelper::operator=(&local_250,&local_228);
      }
      else {
        if (local_240._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_240._M_head_impl);
        }
        pDVar2 = this->message_;
        iVar1 = pDVar2->nested_type_count_;
        if ((long)iVar1 < 1) {
          pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (0,(long)iVar1,"index < nested_type_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_248,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa8a,pcVar8);
LAB_005fad09:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_248);
        }
        pDVar3 = pDVar2->nested_types_;
        this->foo_ = pDVar3;
        if (iVar1 == 1) {
          pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (1,1,"index < nested_type_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_248,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa8a,pcVar8);
          goto LAB_005fad09;
        }
        this->bar_ = pDVar3 + 1;
        local_228.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 2;
        local_250.data_._0_4_ = pDVar2->enum_type_count_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_248,"2","message_->enum_type_count()",(int *)&local_228,
                   (int *)&local_250);
        if (local_248[0] == (string)0x0) {
          testing::Message::Message(&local_228);
          if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               )local_240._M_head_impl ==
              (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               )0x0) {
            pcVar10 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar10 = (pointer)((local_240._M_head_impl)->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_250,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x81e,pcVar10);
          testing::internal::AssertHelper::operator=(&local_250,&local_228);
        }
        else {
          if (local_240._M_head_impl != (LogMessageData *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_240,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_240._M_head_impl);
          }
          iVar1 = this->message_->enum_type_count_;
          if ((long)iVar1 < 1) {
            pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (0,(long)iVar1,"index < enum_type_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_248,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa8b,pcVar8);
            goto LAB_005fad09;
          }
          pEVar4 = this->message_->enum_types_;
          this->baz_ = pEVar4;
          if (iVar1 == 1) {
            pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (1,1,"index < enum_type_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_248,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa8b,pcVar8);
            goto LAB_005fad09;
          }
          this->moo_ = pEVar4 + 1;
          local_228.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = 1;
          local_250.data_._0_4_ = pEVar4->value_count_;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_248,"1","baz_->value_count()",(int *)&local_228,
                     (int *)&local_250);
          if (local_248[0] == (string)0x0) {
            testing::Message::Message(&local_228);
            if (local_240._M_head_impl == (LogMessageData *)0x0) {
              pcVar10 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar10 = (pointer)((local_240._M_head_impl)->entry).full_filename_._M_len;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_250,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x822,pcVar10);
            testing::internal::AssertHelper::operator=(&local_250,&local_228);
          }
          else {
            if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                 )local_240._M_head_impl != (LogMessageData *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_240,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_240._M_head_impl);
            }
            lVar9 = (long)this->baz_->value_count_;
            if (lVar9 < 1) {
              pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (0,lVar9,"index < value_count()");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_248,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xabb,pcVar8);
              goto LAB_005fad09;
            }
            this->a_ = this->baz_->values_;
            local_228.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_4_ = 1;
            local_250.data_._0_4_ = this->moo_->value_count_;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_248,"1","moo_->value_count()",(int *)&local_228,
                       (int *)&local_250);
            if (local_248[0] == (string)0x0) {
              testing::Message::Message(&local_228);
              if (local_240._M_head_impl == (LogMessageData *)0x0) {
                pcVar10 = anon_var_dwarf_a22956 + 5;
              }
              else {
                pcVar10 = (pointer)((local_240._M_head_impl)->entry).full_filename_._M_len;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_250,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                         ,0x824,pcVar10);
              testing::internal::AssertHelper::operator=(&local_250,&local_228);
            }
            else {
              if (local_240._M_head_impl != (LogMessageData *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_240,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_240._M_head_impl);
              }
              lVar9 = (long)this->moo_->value_count_;
              if (lVar9 < 1) {
                pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                   (0,lVar9,"index < value_count()");
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)local_248,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xabb,pcVar8);
                goto LAB_005fad09;
              }
              this->b_ = this->moo_->values_;
              local_228.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ = 1;
              local_250.data_._0_4_ = this->bar_file_->message_type_count_;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_248,"1","bar_file_->message_type_count()",
                         (int *)&local_228,(int *)&local_250);
              if (local_248[0] == (string)0x0) {
                testing::Message::Message(&local_228);
                if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     )local_240._M_head_impl ==
                    (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     )0x0) {
                  pcVar10 = anon_var_dwarf_a22956 + 5;
                }
                else {
                  pcVar10 = (pointer)((local_240._M_head_impl)->entry).full_filename_._M_len;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_250,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                           ,0x827,pcVar10);
                testing::internal::AssertHelper::operator=(&local_250,&local_228);
              }
              else {
                if (local_240._M_head_impl != (LogMessageData *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_240,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_240._M_head_impl);
                }
                lVar9 = (long)this->bar_file_->message_type_count_;
                if (lVar9 < 1) {
                  pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                     (0,lVar9,"index < message_type_count()");
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)local_248,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                             ,0xae7,pcVar8);
                  goto LAB_005fad09;
                }
                pDVar2 = this->bar_file_->message_types_;
                this->message2_ = pDVar2;
                local_228.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_4_ = 2;
                local_250.data_._0_4_ = pDVar2->nested_type_count_;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_248,"2","message2_->nested_type_count()",
                           (int *)&local_228,(int *)&local_250);
                if (local_248[0] == (string)0x0) {
                  testing::Message::Message(&local_228);
                  if (local_240._M_head_impl == (LogMessageData *)0x0) {
                    pcVar10 = anon_var_dwarf_a22956 + 5;
                  }
                  else {
                    pcVar10 = (pointer)((local_240._M_head_impl)->entry).full_filename_._M_len;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_250,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                             ,0x82a,pcVar10);
                  testing::internal::AssertHelper::operator=(&local_250,&local_228);
                }
                else {
                  if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                       )local_240._M_head_impl != (LogMessageData *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_240,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_240._M_head_impl);
                  }
                  pDVar2 = this->message2_;
                  iVar1 = pDVar2->nested_type_count_;
                  if ((long)iVar1 < 1) {
                    pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                       (0,(long)iVar1,"index < nested_type_count()");
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)local_248,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                               ,0xa8a,pcVar8);
                    goto LAB_005fad09;
                  }
                  pDVar3 = pDVar2->nested_types_;
                  this->foo2_ = pDVar3;
                  if (iVar1 == 1) {
                    pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                       (1,1,"index < nested_type_count()");
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)local_248,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                               ,0xa8a,pcVar8);
                    goto LAB_005fad09;
                  }
                  this->baz2_ = pDVar3 + 1;
                  local_228.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._0_4_ = 2;
                  local_250.data_._0_4_ = pDVar2->enum_type_count_;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_248,"2","message2_->enum_type_count()",
                             (int *)&local_228,(int *)&local_250);
                  if (local_248[0] == (string)0x0) {
                    testing::Message::Message(&local_228);
                    if (local_240._M_head_impl == (LogMessageData *)0x0) {
                      pcVar10 = anon_var_dwarf_a22956 + 5;
                    }
                    else {
                      pcVar10 = (pointer)((local_240._M_head_impl)->entry).full_filename_._M_len;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_250,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                               ,0x82e,pcVar10);
                    testing::internal::AssertHelper::operator=(&local_250,&local_228);
                  }
                  else {
                    if (local_240._M_head_impl != (LogMessageData *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_240,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_240._M_head_impl);
                    }
                    iVar1 = this->message2_->enum_type_count_;
                    if ((long)iVar1 < 1) {
                      pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                         (0,(long)iVar1,"index < enum_type_count()");
                      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)local_248,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                                 ,0xa8b,pcVar8);
                      goto LAB_005fad09;
                    }
                    pEVar4 = this->message2_->enum_types_;
                    this->moo2_ = pEVar4;
                    if (iVar1 == 1) {
                      pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                         (1,1,"index < enum_type_count()");
                      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)local_248,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                                 ,0xa8b,pcVar8);
                      goto LAB_005fad09;
                    }
                    this->mooo2_ = pEVar4 + 1;
                    local_228.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._0_4_ = 1;
                    local_250.data_._0_4_ = pEVar4->value_count_;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_248,"1","moo2_->value_count()",(int *)&local_228,
                               (int *)&local_250);
                    if (local_248[0] == (string)0x0) {
                      testing::Message::Message(&local_228);
                      if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                           )local_240._M_head_impl ==
                          (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                           )0x0) {
                        pcVar10 = anon_var_dwarf_a22956 + 5;
                      }
                      else {
                        pcVar10 = (pointer)((local_240._M_head_impl)->entry).full_filename_._M_len;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_250,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                                 ,0x832,pcVar10);
                      testing::internal::AssertHelper::operator=(&local_250,&local_228);
                    }
                    else {
                      if (local_240._M_head_impl != (LogMessageData *)0x0) {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_240,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_240._M_head_impl);
                      }
                      lVar9 = (long)this->moo2_->value_count_;
                      if (lVar9 < 1) {
                        pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                           (0,lVar9,"index < value_count()");
                        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                  ((LogMessageFatal *)local_248,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                                   ,0xabb,pcVar8);
                        goto LAB_005fad09;
                      }
                      this->a2_ = this->moo2_->values_;
                      local_228.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._0_4_ = 1;
                      local_250.data_._0_4_ = this->mooo2_->value_count_;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)local_248,"1","mooo2_->value_count()",(int *)&local_228
                                 ,(int *)&local_250);
                      if (local_248[0] != (string)0x0) {
                        if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                             )local_240._M_head_impl != (LogMessageData *)0x0) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_240,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_240._M_head_impl);
                        }
                        lVar9 = (long)this->mooo2_->value_count_;
                        if (lVar9 < 1) {
                          pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                             (0,lVar9,"index < value_count()");
                          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                    ((LogMessageFatal *)local_248,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                                     ,0xabb,pcVar8);
                          goto LAB_005fad09;
                        }
                        this->c2_ = this->mooo2_->values_;
                        goto LAB_005faa66;
                      }
                      testing::Message::Message(&local_228);
                      if (local_240._M_head_impl == (LogMessageData *)0x0) {
                        pcVar10 = anon_var_dwarf_a22956 + 5;
                      }
                      else {
                        pcVar10 = (pointer)((local_240._M_head_impl)->entry).full_filename_._M_len;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_250,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                                 ,0x834,pcVar10);
                      testing::internal::AssertHelper::operator=(&local_250,&local_228);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((long *)CONCAT44(local_228.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_228.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_228.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_228.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
    if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_240._M_head_impl ==
        (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)0x0)
    goto LAB_005faa66;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_240;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_240._M_head_impl);
LAB_005faa66:
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_210);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
  return;
}

Assistant:

void SetUp() override {
    // Build descriptors for the following definitions:
    //
    //   // in "foo.proto"
    //   message TestMessage {
    //     message Foo {}
    //     message Bar {}
    //     enum Baz { A = 1; }
    //     enum Moo { B = 1; }
    //   }
    //
    //   // in "bar.proto"
    //   package corge.grault;
    //   message TestMessage2 {
    //     message Foo {}
    //     message Baz {}
    //     enum Moo  { A = 1; }
    //     enum Mooo { C = 1; }
    //   }
    //
    // TestMessage2 is primarily here to test FindNestedTypeByName and friends.
    // All messages created from the same DescriptorPool share the same lookup
    // table, so we need to insure that they don't interfere.
    //
    // We add enum values to the enums in order to test searching for enum
    // values across a message's scope.

    FileDescriptorProto foo_file;
    foo_file.set_name("foo.proto");

    DescriptorProto* message = AddMessage(&foo_file, "TestMessage");
    AddNestedMessage(message, "Foo");
    AddNestedMessage(message, "Bar");
    EnumDescriptorProto* baz = AddNestedEnum(message, "Baz");
    AddEnumValue(baz, "A", 1);
    EnumDescriptorProto* moo = AddNestedEnum(message, "Moo");
    AddEnumValue(moo, "B", 1);

    FileDescriptorProto bar_file;
    bar_file.set_name("bar.proto");
    bar_file.set_package("corge.grault");

    DescriptorProto* message2 = AddMessage(&bar_file, "TestMessage2");
    AddNestedMessage(message2, "Foo");
    AddNestedMessage(message2, "Baz");
    EnumDescriptorProto* moo2 = AddNestedEnum(message2, "Moo");
    AddEnumValue(moo2, "A", 1);
    EnumDescriptorProto* mooo2 = AddNestedEnum(message2, "Mooo");
    AddEnumValue(mooo2, "C", 1);

    // Build the descriptors and get the pointers.
    foo_file_ = pool_.BuildFile(foo_file);
    ASSERT_TRUE(foo_file_ != nullptr);

    bar_file_ = pool_.BuildFile(bar_file);
    ASSERT_TRUE(bar_file_ != nullptr);

    ASSERT_EQ(1, foo_file_->message_type_count());
    message_ = foo_file_->message_type(0);

    ASSERT_EQ(2, message_->nested_type_count());
    foo_ = message_->nested_type(0);
    bar_ = message_->nested_type(1);

    ASSERT_EQ(2, message_->enum_type_count());
    baz_ = message_->enum_type(0);
    moo_ = message_->enum_type(1);

    ASSERT_EQ(1, baz_->value_count());
    a_ = baz_->value(0);
    ASSERT_EQ(1, moo_->value_count());
    b_ = moo_->value(0);

    ASSERT_EQ(1, bar_file_->message_type_count());
    message2_ = bar_file_->message_type(0);

    ASSERT_EQ(2, message2_->nested_type_count());
    foo2_ = message2_->nested_type(0);
    baz2_ = message2_->nested_type(1);

    ASSERT_EQ(2, message2_->enum_type_count());
    moo2_ = message2_->enum_type(0);
    mooo2_ = message2_->enum_type(1);

    ASSERT_EQ(1, moo2_->value_count());
    a2_ = moo2_->value(0);
    ASSERT_EQ(1, mooo2_->value_count());
    c2_ = mooo2_->value(0);
  }